

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintWriter.cpp
# Opt level: O3

void __thiscall
OpenMD::ConstraintWriter::writeConstraintForces
          (ConstraintWriter *this,
          list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *constraints)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  RealType RVar3;
  
  for (p_Var1 = (constraints->
                super__List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)constraints;
      p_Var1 = (((_List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (*(char *)&p_Var1[1]._M_next[2]._M_next == '\x01') {
      RVar3 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
      poVar2 = std::ostream::_M_insert<double>(RVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)(*(long *)(p_Var1[1]._M_next)->_M_next + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)((long)(p_Var1[1]._M_next)->_M_prev->_M_next + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(_List_node_base **)((long)(p_Var1[1]._M_next + 1) + 8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void ConstraintWriter::writeConstraintForces(
      const std::list<ConstraintPair*>& constraints) {
#ifndef IS_MPI
    std::list<ConstraintPair*>::const_iterator i;
    for (i = constraints.begin(); i != constraints.end(); ++i) {
      if ((*i)->getPrintForce()) {
        output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
                << "\t" << (*i)->getConsElem1()->getGlobalIndex() << "\t"
                << (*i)->getConsElem2()->getGlobalIndex() << "\t"
                << (*i)->getConstraintForce() << std::endl;
      }
    }
#else

    const int primaryNode = 0;
    int nproc;
    int myNode;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);
    MPI_Comm_rank(MPI_COMM_WORLD, &myNode);

    std::vector<int> nConstraints(nproc, 0);
    nConstraints[myNode] = constraints.size();

    // do MPI_ALLREDUCE to exchange the total number of constraints:
    MPI_Allreduce(MPI_IN_PLACE, &nConstraints[0], nproc, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    MPI_Status ierr;
    int atom1, atom2, doPrint;
    RealType force;

    if (myNode == primaryNode) {
      std::vector<ConstraintData> constraintData;
      ConstraintData tmpData;
      for (int i = 0; i < nproc; ++i) {
        if (i == primaryNode) {
          std::list<ConstraintPair*>::const_iterator j;
          for (j = constraints.begin(); j != constraints.end(); ++j) {
            tmpData.atom1           = (*j)->getConsElem1()->getGlobalIndex();
            tmpData.atom2           = (*j)->getConsElem2()->getGlobalIndex();
            tmpData.constraintForce = (*j)->getConstraintForce();
            tmpData.printForce      = (*j)->getPrintForce();
            constraintData.push_back(tmpData);
          }

        } else {
          for (int k = 0; k < nConstraints[i]; ++k) {
            MPI_Recv(&atom1, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&atom2, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&force, 1, MPI_REALTYPE, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&doPrint, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);

            tmpData.atom1           = atom1;
            tmpData.atom2           = atom2;
            tmpData.constraintForce = force;
            tmpData.printForce      = (doPrint == 0) ? false : true;
            constraintData.push_back(tmpData);
          }
        }
      }

      std::vector<ConstraintData>::iterator l;
      for (l = constraintData.begin(); l != constraintData.end(); ++l) {
        if (l->printForce) {
          output_
              << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
              << "\t" << l->atom1 << "\t" << l->atom2 << "\t"
              << l->constraintForce << std::endl;
        }
      }
    } else {
      std::list<ConstraintPair*>::const_iterator j;
      for (j = constraints.begin(); j != constraints.end(); ++j) {
        int atom1                = (*j)->getConsElem1()->getGlobalIndex();
        int atom2                = (*j)->getConsElem2()->getGlobalIndex();
        RealType constraintForce = (*j)->getConstraintForce();
        int printForce           = (int)(*j)->getPrintForce();

        MPI_Send(&atom1, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&atom2, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&constraintForce, 1, MPI_REALTYPE, primaryNode, 0,
                 MPI_COMM_WORLD);
        MPI_Send(&printForce, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
      }
    }
#endif
  }